

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_radixsort.h
# Opt level: O2

void gim_down_heap<GIM_RSORT_TOKEN,GIM_RSORT_TOKEN_COMPARATOR>(long pArr,uint k,uint n)

{
  undefined8 uVar1;
  uint uVar2;
  
  uVar1 = *(undefined8 *)(pArr + (ulong)(k - 1) * 8);
  while (k <= n >> 1) {
    uVar2 = k * 2;
    if ((int)uVar2 < (int)n) {
      uVar2 = uVar2 | (uint)(*(int *)(pArr + -8 + (long)(int)uVar2 * 8) -
                            *(int *)(pArr + (long)(int)uVar2 * 8)) >> 0x1f;
    }
    if (-1 < (int)uVar1 - *(int *)(pArr + -8 + (long)(int)uVar2 * 8)) break;
    *(undefined8 *)(pArr + (ulong)(k - 1) * 8) = *(undefined8 *)(pArr + -8 + (long)(int)uVar2 * 8);
    k = uVar2;
  }
  *(undefined8 *)(pArr + (ulong)(k - 1) * 8) = uVar1;
  return;
}

Assistant:

void gim_down_heap(T *pArr, GUINT k, GUINT n,COMP_CLASS CompareFunc)
{
	/*  PRE: a[k+1..N] is a heap */
	/* POST:  a[k..N]  is a heap */

	T temp = pArr[k - 1];
	/* k has child(s) */
	while (k <= n/2)
	{
		int child = 2*k;

		if ((child < (int)n) && CompareFunc(pArr[child - 1] , pArr[child])<0)
		{
			child++;
		}
		/* pick larger child */
		if (CompareFunc(temp , pArr[child - 1])<0)
		{
			/* move child up */
			pArr[k - 1] = pArr[child - 1];
			k = child;
		}
		else
		{
			break;
		}
	}
	pArr[k - 1] = temp;
}